

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall glslang::HlslParseContext::hasStructBuffCounter(HlslParseContext *this,TType *type)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  TType *type_local;
  HlslParseContext *this_local;
  
  iVar2 = (*type->_vptr_TType[0xb])();
  uVar1 = *(ushort *)(CONCAT44(extraout_var,iVar2) + 10) & 0x1ff;
  this_local._7_1_ = uVar1 == 0x96 || uVar1 == 0x97;
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::hasStructBuffCounter(const TType& type) const
{
    switch (type.getQualifier().declaredBuiltIn) {
    case EbvAppendConsume:       // fall through...
    case EbvRWStructuredBuffer:  // ...
        return true;
    default:
        return false; // the other structuredbuffer types do not have a counter.
    }
}